

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_EnumState_Test::~StatePointer_EnumState_Test
          (StatePointer_EnumState_Test *this)

{
  StatePointer_EnumState_Test *this_local;
  
  ~StatePointer_EnumState_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StatePointer, EnumState) {
	Foo foo;
	state_ptr<Foo, Bar> p{&foo, Bar::A};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), Bar::A);
	p.set_state(Bar::B);
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), Bar::B);
}